

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

bool __thiscall QTextEditMimeData::hasFormat(QTextEditMimeData *this,QString *format)

{
  char *pcVar1;
  char16_t *pcVar2;
  long lVar3;
  char cVar4;
  undefined1 uVar5;
  long lVar6;
  ulong uVar7;
  int i;
  long lVar8;
  QStringView QVar9;
  QLatin1String QVar10;
  
  cVar4 = QTextDocumentFragment::isEmpty();
  if (cVar4 != '\0') {
    uVar5 = QMimeData::hasFormat((QString *)this);
    return (bool)uVar5;
  }
  pcVar2 = (format->d).ptr;
  lVar3 = (format->d).size;
  lVar8 = 0;
  while( true ) {
    uVar7 = (ulong)supportedMimeTypes.m_offsets._M_elems[lVar8];
    QVar10.m_data = supportedMimeTypes.m_string._M_elems + uVar7;
    lVar6 = -1;
    do {
      pcVar1 = (char *)(uVar7 + 0x6e2de9 + lVar6);
      lVar6 = lVar6 + 1;
    } while (*pcVar1 != '\0');
    if ((lVar3 == lVar6) &&
       (QVar9.m_data = pcVar2, QVar9.m_size = lVar3, QVar10.m_size = lVar3,
       cVar4 = QtPrivate::equalStrings(QVar9,QVar10), cVar4 != '\0')) break;
    lVar8 = lVar8 + 1;
    if (lVar8 == 4) {
      return false;
    }
  }
  return true;
}

Assistant:

bool QTextEditMimeData::hasFormat(const QString &format) const
{
    if (!fragment.isEmpty()) {
        constexpr auto size = supportedMimeTypes.count();
        for (int i = 0; i < size; ++i) {
            if (format == QLatin1StringView(supportedMimeTypes.at(i)))
                return true;
        }
        return false;
    }

    return QMimeData::hasFormat(format);
}